

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_AddTxIn_RemoveTxIn_Test::TestBody
          (AbstractTransaction_AddTxIn_RemoveTxIn_Test *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  AbstractTxInReference *pAVar4;
  char *pcVar5;
  AssertHelper local_388;
  Message local_380;
  uint local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_5;
  Message local_358;
  AssertHelper local_350;
  Message local_348 [2];
  CfdException *anon_var_0;
  char *pcStack_330;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_320;
  uint local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_4;
  Message local_2f8;
  uint32_t local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_3;
  Message local_2d0;
  uint32_t local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_2;
  Message local_2a8;
  Script local_2a0;
  string local_268 [32];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_1;
  Message local_230;
  Txid local_228;
  string local_208 [32];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> list;
  AssertHelper local_1c0;
  Message local_1b8;
  Script local_1b0;
  allocator local_171;
  string local_170 [32];
  Txid local_150;
  AssertHelper local_130;
  Message local_128;
  allocator local_119;
  string local_118 [32];
  Script local_f8;
  allocator local_b9;
  string local_b8 [32];
  Txid local_98;
  undefined1 local_68 [8];
  Transaction tx;
  uint local_24;
  uint local_20;
  uint32_t seq;
  uint32_t vout;
  uint32_t locktime;
  int32_t version;
  uint32_t txin_count;
  AbstractTransaction_AddTxIn_RemoveTxIn_Test *this_local;
  
  locktime = 2;
  vout = 2;
  seq = 3;
  local_20 = 0;
  local_24 = 0xffffffff;
  _version = this;
  cfd::core::Transaction::Transaction((Transaction *)local_68,2,3);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
                 &local_b9);
      cfd::core::Txid::Txid(&local_98,local_b8);
      uVar2 = local_20;
      uVar1 = local_24;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_118,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",&local_119);
      cfd::core::Script::Script(&local_f8,local_118);
      cfd::core::Transaction::AddTxIn((Txid *)local_68,(uint)&local_98,uVar2,(Script *)(ulong)uVar1)
      ;
      cfd::core::Script::~Script(&local_f8);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      cfd::core::Txid::~Txid(&local_98);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
  }
  else {
    testing::Message::Message(&local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x6e,
               "Expected: tx.AddTxIn( Txid( \"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6\"), vout, seq, Script(\"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597",
                 &local_171);
      cfd::core::Txid::Txid(&local_150,local_170);
      uVar2 = local_20;
      uVar1 = local_24;
      cfd::core::Script::Script(&local_1b0);
      cfd::core::Transaction::AddTxIn
                ((Txid *)local_68,(uint)&local_150,uVar2,(Script *)(ulong)uVar1);
      cfd::core::Script::~Script(&local_1b0);
      cfd::core::Txid::~Txid(&local_150);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
    }
  }
  else {
    testing::Message::Message(&local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x75,
               "Expected: tx.AddTxIn( Txid( \"0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597\"), vout, seq, Script()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  cfd::core::Transaction::GetTxInList();
  pAVar4 = (AbstractTxInReference *)
           std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
           operator[]((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *
                      )&gtest_ar.message_,0);
  cfd::core::AbstractTxInReference::GetTxid(&local_228,pAVar4);
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1e8,"list[0].GetTxid().GetHex().c_str()",
             "\"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6\"",pcVar5,
             "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6");
  std::__cxx11::string::~string(local_208);
  cfd::core::Txid::~Txid(&local_228);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar3) {
    testing::Message::Message(&local_230);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pAVar4 = (AbstractTxInReference *)
           std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
           operator[]((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *
                      )&gtest_ar.message_,0);
  cfd::core::AbstractTxInReference::GetUnlockingScript(&local_2a0,pAVar4);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_248,"list[0].GetUnlockingScript().GetHex().c_str()",
             "\"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac\"",pcVar5,
             "76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac");
  std::__cxx11::string::~string(local_268);
  cfd::core::Script::~Script(&local_2a0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar3) {
    testing::Message::Message(&local_2a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  pAVar4 = (AbstractTxInReference *)
           std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
           operator[]((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *
                      )&gtest_ar.message_,0);
  local_2c4 = cfd::core::AbstractTxInReference::GetVout(pAVar4);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_2c0,"list[0].GetVout()","vout",&local_2c4,&local_20);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar3) {
    testing::Message::Message(&local_2d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  pAVar4 = (AbstractTxInReference *)
           std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
           operator[]((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *
                      )&gtest_ar.message_,0);
  local_2ec = cfd::core::AbstractTxInReference::GetSequence(pAVar4);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_2e8,"list[0].GetSequence()","seq",&local_2ec,&local_24);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar3) {
    testing::Message::Message(&local_2f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_314 = cfd::core::Transaction::GetTxInCount();
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_310,"tx.GetTxInCount()","txin_count",&local_314,&locktime);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar3) {
    testing::Message::Message(&local_320);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x7f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffcd0,"");
  bVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffcd0);
  if (bVar3) {
    anon_var_0._7_1_ = 0;
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::Transaction::RemoveTxIn((uint)local_68);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_002b07b8;
    pcStack_330 = 
    "Expected: tx.RemoveTxIn(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_348);
  testing::internal::AssertHelper::AssertHelper
            (&local_350,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0x82,pcStack_330);
  testing::internal::AssertHelper::operator=(&local_350,local_348);
  testing::internal::AssertHelper::~AssertHelper(&local_350);
  testing::Message::~Message(local_348);
LAB_002b07b8:
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::Transaction::RemoveTxIn((uint)local_68);
    }
  }
  else {
    testing::Message::Message(&local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x84,"Expected: tx.RemoveTxIn(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_358);
  }
  locktime = locktime - 1;
  local_374 = cfd::core::Transaction::GetTxInCount();
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_370,"tx.GetTxInCount()","txin_count",&local_374,&locktime);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar3) {
    testing::Message::Message(&local_380);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x86,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &gtest_ar.message_);
  cfd::core::Transaction::~Transaction((Transaction *)local_68);
  return;
}

Assistant:

TEST(AbstractTransaction, AddTxIn_RemoveTxIn) {
  uint32_t txin_count = 2;
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  // script is not empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
          vout, seq,
          Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac")));

  // script is empty
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "0d0afd7c8e65545f877fa58905d3b50aa114ed885becd6c12232b1d494a7d597"),
          vout, seq, Script()));

  std::vector<TxInReference> list = tx.GetTxInList();
  EXPECT_STREQ(
      list[0].GetTxid().GetHex().c_str(),
      "e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6");
  EXPECT_STREQ(list[0].GetUnlockingScript().GetHex().c_str(),
               "76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac");
  EXPECT_EQ(list[0].GetVout(), vout);
  EXPECT_EQ(list[0].GetSequence(), seq);
  EXPECT_EQ(tx.GetTxInCount(), txin_count);

  // index error
  EXPECT_THROW(tx.RemoveTxIn(3), CfdException);
  // remove success
  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  txin_count--;
  EXPECT_EQ(tx.GetTxInCount(), txin_count);
}